

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory_unix.cpp
# Opt level: O3

bool findFiles(string *path,string *fileMask,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *fileList,bool savePaths)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  undefined7 in_register_00000009;
  ulong uVar4;
  dirent64 *__ptr;
  dirent **namelist;
  string fileName;
  dirent64 **local_90;
  undefined4 local_84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string *local_40;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_38;
  
  local_84 = (undefined4)CONCAT71(in_register_00000009,savePaths);
  local_40 = path;
  local_38 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)fileList;
  uVar1 = scandir64((path->_M_dataplus)._M_p,&local_90,(__selector *)0x0,(__cmp *)0x0);
  if (-1 < (int)uVar1) {
    if (uVar1 != 0) {
      uVar4 = (ulong)uVar1;
      do {
        __ptr = local_90[uVar4 - 1];
        if (__ptr->d_type == '\b') {
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          sVar3 = strlen(__ptr->d_name);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_80,__ptr->d_name,__ptr->d_name + sVar3);
          iVar2 = fnmatch((fileMask->_M_dataplus)._M_p,local_80._M_dataplus._M_p,0);
          if (iVar2 == 0) {
            if ((char)local_84 == '\0') {
              local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_60,local_80._M_dataplus._M_p,
                         local_80._M_dataplus._M_p + local_80._M_string_length);
            }
            else {
              std::operator+(&local_60,local_40,&local_80);
            }
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_38,&local_60);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          __ptr = local_90[uVar4 - 1];
        }
        uVar4 = uVar4 - 1;
        free(__ptr);
      } while (uVar4 != 0);
    }
    free(local_90);
  }
  return -1 < (int)uVar1;
}

Assistant:

bool findFiles(const string& path, const string& fileMask, vector<string>* fileList, bool savePaths)
{
    dirent** namelist;

    int n = scandir(path.c_str(), &namelist, 0, 0);  // alphasort);

    if (n < 0)
    {
        return false;
    }
    else
    {
        while (n--)
        {
            if (namelist[n]->d_type == DT_REG)
            {
                string fileName(namelist[n]->d_name);

                if (0 == fnmatch(fileMask.c_str(), fileName.c_str(), 0))
                    fileList->push_back(savePaths ? path + fileName : fileName);
            }
            free(namelist[n]);
        }
        free(namelist);
    }

    return true;
}